

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HumanDetector.cpp
# Opt level: O0

vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> * __thiscall
HumanDetector::detectHuman
          (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *__return_storage_ptr__,
          HumanDetector *this,Mat *image)

{
  IDescriptor *pIVar1;
  ostream *this_00;
  size_type sVar2;
  void *this_01;
  Mat local_88 [103];
  undefined1 local_21;
  Mat *local_20;
  Mat *image_local;
  HumanDetector *this_local;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *found;
  
  local_21 = 0;
  pIVar1 = this->descriptor;
  local_20 = image;
  image_local = (Mat *)this;
  this_local = (HumanDetector *)__return_storage_ptr__;
  cv::Mat::Mat(local_88,image);
  (**pIVar1->_vptr_IDescriptor)(__return_storage_ptr__,pIVar1,local_88);
  cv::Mat::~Mat(local_88);
  this_00 = std::operator<<((ostream *)&std::cout,"Number of humans detected: ");
  sVar2 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                    (__return_storage_ptr__);
  this_01 = (void *)std::ostream::operator<<(this_00,sVar2);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::Rect> HumanDetector::detectHuman(cv::Mat image) {
  // delegate to helper class
  std::vector<cv::Rect> found = descriptor->detect(image);
  std::cout << "Number of humans detected: " << found.size() << std::endl;
  return found;
}